

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,AdvanceClock *a)

{
  CodeLocation local_28;
  AdvanceClock *local_18;
  AdvanceClock *a_local;
  HEARTGenerator *this_local;
  
  local_18 = a;
  a_local = (AdvanceClock *)this;
  CodeLocation::CodeLocation
            (&local_28,&(a->super_Expression).super_Statement.super_ASTObject.context.location);
  FunctionBuilder::addAdvance(&this->builder,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  return;
}

Assistant:

void visit (AST::AdvanceClock& a) override
    {
        builder.addAdvance (a.context.location);
    }